

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

void __thiscall
fmp4_stream::ingest_stream::patch_tfdt
          (ingest_stream *this,uint64_t time_anchor,bool applytimescale,uint32_t anchor_scale)

{
  long lVar1;
  uint32_t uVar2;
  pointer pmVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if ((int)CONCAT71(in_register_00000011,applytimescale) != 0) {
    uVar2 = init_fragment::get_time_scale(&this->init_fragment_);
    if (uVar2 != 0) {
      time_anchor = (uVar2 * time_anchor) / (ulong)anchor_scale;
    }
  }
  pmVar3 = (this->media_fragment_).
           super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = 0;
  if (pmVar3 != (this->media_fragment_).
                super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
                ._M_impl.super__Vector_impl_data._M_start && !applytimescale) {
    uVar2 = *(int *)&pmVar3[-1].mfhd_.super_full_box.field_0x6c + 1;
  }
  pmVar3 = (this->media_fragment_).
           super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->media_fragment_).
      super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>.
      _M_impl.super__Vector_impl_data._M_finish != pmVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      media_fragment::patch_tfdt(pmVar3 + uVar4,time_anchor,uVar2);
      pmVar3 = (this->media_fragment_).
               super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->media_fragment_).
                     super__Vector_base<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3 >> 3) *
              0x1cac083126e978d5;
      uVar2 = uVar2 + 1;
      bVar6 = uVar5 <= uVar4;
      lVar1 = uVar4 - uVar5;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar6 && lVar1 != 0);
  }
  return;
}

Assistant:

void ingest_stream::patch_tfdt(uint64_t time_anchor, bool applytimescale, uint32_t anchor_scale)
	{
		if (applytimescale) {
			uint32_t timescale = 0;
			timescale = this->init_fragment_.get_time_scale();
			if(timescale)
			   time_anchor = time_anchor * timescale / anchor_scale; // offset to add to the timestamps
		}

		uint32_t seq_nr = 0;
		
		// only patch sequence number in the case when no timescale is applied 
		if (media_fragment_.size() && !applytimescale)
			seq_nr = 1 + this->media_fragment_[media_fragment_.size()-1].mfhd_.seq_nr_;

		for (uint32_t i = 0; i < this->media_fragment_.size(); i++)
		{
				this->media_fragment_[i].patch_tfdt(time_anchor, seq_nr + i);
		}	
	}